

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

int get_ext_tx_set(TX_SIZE tx_size,int is_inter,int use_reduced_set)

{
  byte bVar1;
  int in_EDX;
  int in_ESI;
  TX_SIZE in_DIL;
  TxSetType set_type;
  
  bVar1 = av1_get_ext_tx_set_type(in_DIL,in_ESI,in_EDX);
  return ext_tx_set_index[in_ESI][bVar1];
}

Assistant:

static inline int get_ext_tx_set(TX_SIZE tx_size, int is_inter,
                                 int use_reduced_set) {
  const TxSetType set_type =
      av1_get_ext_tx_set_type(tx_size, is_inter, use_reduced_set);
  return ext_tx_set_index[is_inter][set_type];
}